

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

_Bool is_operation_timed_out
                (TICK_COUNTER_HANDLE tick_cntr_handle,tickcounter_ms_t compare_time,
                size_t timeout_seconds)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  tickcounter_ms_t curr_tick;
  size_t sStack_20;
  _Bool result;
  size_t timeout_seconds_local;
  tickcounter_ms_t compare_time_local;
  TICK_COUNTER_HANDLE tick_cntr_handle_local;
  
  sStack_20 = timeout_seconds;
  timeout_seconds_local = compare_time;
  compare_time_local = (tickcounter_ms_t)tick_cntr_handle;
  iVar1 = tickcounter_get_current_ms(tick_cntr_handle,(tickcounter_ms_t *)&l);
  if (iVar1 == 0) {
    curr_tick._7_1_ = sStack_20 < ((long)l - timeout_seconds_local) / 1000;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"is_operation_timed_out",0x53,1,"Failure getting tickcounter value");
    }
    curr_tick._7_1_ = true;
  }
  return curr_tick._7_1_;
}

Assistant:

static bool is_operation_timed_out(TICK_COUNTER_HANDLE tick_cntr_handle, tickcounter_ms_t compare_time, size_t timeout_seconds)
{
    bool result;
    tickcounter_ms_t curr_tick;
    if (tickcounter_get_current_ms(tick_cntr_handle, &curr_tick) != 0)
    {
        LogError("Failure getting tickcounter value");
        result = true;
    }
    else
    {
        result = (((curr_tick - compare_time) / 1000 > timeout_seconds));
    }
    return result;
}